

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::Promise<void>_>::setCapacity(Vector<kj::Promise<void>_> *this,size_t newSize)

{
  Promise<void> *pPVar1;
  Promise<void> *pPVar2;
  RemoveConst<kj::Promise<void>_> *pRVar3;
  __off_t in_RDX;
  ArrayBuilder<kj::Promise<void>_> newBuilder;
  ArrayBuilder<kj::Promise<void>_> local_38;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 3)) {
    ArrayBuilder<kj::Promise<void>_>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Promise<void> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pPVar2 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pPVar1 = (this->builder).ptr; pPVar1 != pPVar2; pPVar1 = pPVar1 + 1) {
    ((local_38.pos)->super_PromiseBase).node.ptr = (pPVar1->super_PromiseBase).node.ptr;
    (pPVar1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::Promise<void>_>::operator=(&this->builder,&local_38);
  pPVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pPVar1 = local_38.ptr;
  if (local_38.ptr != (Promise<void> *)0x0) {
    local_38.ptr = (Promise<void> *)0x0;
    local_38.pos = (RemoveConst<kj::Promise<void>_> *)0x0;
    local_38.endPtr = (Promise<void> *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pPVar1,8,(long)pRVar3 - (long)pPVar1 >> 3,
               (long)pPVar2 - (long)pPVar1 >> 3,
               ArrayDisposer::Dispose_<kj::Promise<void>_>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }